

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorProperty
          (FBXConverter *this,PropertyTable *props,string *colorName,bool *result,bool useTemplate)

{
  PropertyTable *this_00;
  Property *pPVar1;
  long lVar2;
  undefined7 in_register_00000081;
  char in_R9B;
  undefined8 uVar3;
  ai_real aVar4;
  aiColor3D aVar5;
  
  *(undefined1 *)CONCAT71(in_register_00000081,useTemplate) = 1;
  pPVar1 = PropertyTable::Get((PropertyTable *)colorName,(string *)result);
  if (pPVar1 == (Property *)0x0) {
    if ((in_R9B != '\0') &&
       (this_00 = (PropertyTable *)colorName[3]._M_dataplus._M_p, this_00 != (PropertyTable *)0x0))
    {
      pPVar1 = PropertyTable::Get(this_00,(string *)result);
      if (pPVar1 != (Property *)0x0) goto LAB_005dfbb1;
    }
  }
  else {
LAB_005dfbb1:
    lVar2 = __dynamic_cast(pPVar1,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0)
    ;
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)(lVar2 + 8);
      aVar4 = *(ai_real *)(lVar2 + 0x10);
      goto LAB_005dfc00;
    }
  }
  *(undefined1 *)CONCAT71(in_register_00000081,useTemplate) = 0;
  uVar3 = 0;
  aVar4 = 0.0;
LAB_005dfc00:
  *(undefined8 *)this = uVar3;
  *(ai_real *)
   &(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = aVar4;
  aVar5.b = aVar4;
  aVar5.r = (ai_real)(int)uVar3;
  aVar5.g = (ai_real)(int)((ulong)uVar3 >> 0x20);
  return aVar5;
}

Assistant:

aiColor3D FBXConverter::GetColorProperty(const PropertyTable& props, const std::string& colorName,
            bool& result, bool useTemplate)
        {
            result = true;
            bool ok;
            const aiVector3D& ColorVec = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }
            return aiColor3D(ColorVec.x, ColorVec.y, ColorVec.z);
        }